

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfTiledInputFile.cpp
# Opt level: O0

void __thiscall
Imf_2_5::TiledInputFile::setFrameBuffer(TiledInputFile *this,FrameBuffer *frameBuffer)

{
  double fv;
  size_t xs;
  size_t ys;
  byte bVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  ostream *poVar5;
  ArgExc *this_00;
  char *pcVar6;
  char *pcVar7;
  Slice *pSVar8;
  Channel *pCVar9;
  bool fill;
  ConstIterator j_1;
  ConstIterator i;
  vector<Imf_2_5::(anonymous_namespace)::TInSliceInfo,_std::allocator<Imf_2_5::(anonymous_namespace)::TInSliceInfo>_>
  slices;
  stringstream _iex_throw_s;
  ConstIterator i_1;
  ConstIterator j;
  ChannelList *channels;
  Lock lock;
  uint in_stack_fffffffffffffb08;
  undefined4 in_stack_fffffffffffffb0c;
  undefined4 in_stack_fffffffffffffb10;
  undefined4 in_stack_fffffffffffffb14;
  undefined4 in_stack_fffffffffffffb18;
  undefined4 in_stack_fffffffffffffb1c;
  uint in_stack_fffffffffffffb20;
  undefined4 in_stack_fffffffffffffb24;
  byte local_4aa;
  vector<Imf_2_5::(anonymous_namespace)::TInSliceInfo,_std::allocator<Imf_2_5::(anonymous_namespace)::TInSliceInfo>_>
  *in_stack_fffffffffffffba8;
  Slice *in_stack_fffffffffffffbb0;
  PixelType local_42c;
  undefined4 in_stack_fffffffffffffc10;
  undefined4 in_stack_fffffffffffffc14;
  PixelType PVar10;
  ChannelList *in_stack_fffffffffffffc18;
  TInSliceInfo local_2e0;
  const_iterator local_2a8;
  const_iterator local_2a0;
  TInSliceInfo local_298;
  const_iterator local_260;
  byte local_251;
  TInSliceInfo local_250;
  const_iterator local_218;
  const_iterator local_210;
  const_iterator local_208;
  const_iterator local_200;
  stringstream local_1e0 [16];
  ostream local_1d0 [376];
  const_iterator local_58;
  const_iterator local_50;
  const_iterator local_48;
  const_iterator local_40;
  ChannelList *local_28;
  
  IlmThread_2_5::Lock::Lock
            ((Lock *)CONCAT44(in_stack_fffffffffffffb24,in_stack_fffffffffffffb20),
             (Mutex *)CONCAT44(in_stack_fffffffffffffb1c,in_stack_fffffffffffffb18),
             SUB41((uint)in_stack_fffffffffffffb14 >> 0x18,0));
  local_28 = Header::channels((Header *)0x2a37a9);
  local_40._M_node =
       (_Base_ptr)
       FrameBuffer::begin((FrameBuffer *)
                          CONCAT44(in_stack_fffffffffffffb0c,in_stack_fffffffffffffb08));
  do {
    local_48._M_node =
         (_Base_ptr)
         FrameBuffer::end((FrameBuffer *)
                          CONCAT44(in_stack_fffffffffffffb0c,in_stack_fffffffffffffb08));
    bVar2 = Imf_2_5::operator!=((ConstIterator *)
                                CONCAT44(in_stack_fffffffffffffb14,in_stack_fffffffffffffb10),
                                (ConstIterator *)
                                CONCAT44(in_stack_fffffffffffffb0c,in_stack_fffffffffffffb08));
    if (!bVar2) {
      std::
      vector<Imf_2_5::(anonymous_namespace)::TInSliceInfo,_std::allocator<Imf_2_5::(anonymous_namespace)::TInSliceInfo>_>
      ::vector((vector<Imf_2_5::(anonymous_namespace)::TInSliceInfo,_std::allocator<Imf_2_5::(anonymous_namespace)::TInSliceInfo>_>
                *)0x2a3b12);
      local_200._M_node =
           (_Base_ptr)
           ChannelList::begin((ChannelList *)
                              CONCAT44(in_stack_fffffffffffffb0c,in_stack_fffffffffffffb08));
      local_208._M_node =
           (_Base_ptr)
           FrameBuffer::begin((FrameBuffer *)
                              CONCAT44(in_stack_fffffffffffffb0c,in_stack_fffffffffffffb08));
      while( true ) {
        local_210._M_node =
             (_Base_ptr)
             FrameBuffer::end((FrameBuffer *)
                              CONCAT44(in_stack_fffffffffffffb0c,in_stack_fffffffffffffb08));
        bVar2 = Imf_2_5::operator!=((ConstIterator *)
                                    CONCAT44(in_stack_fffffffffffffb14,in_stack_fffffffffffffb10),
                                    (ConstIterator *)
                                    CONCAT44(in_stack_fffffffffffffb0c,in_stack_fffffffffffffb08));
        if (!bVar2) break;
        while( true ) {
          local_218._M_node =
               (_Base_ptr)
               ChannelList::end((ChannelList *)
                                CONCAT44(in_stack_fffffffffffffb0c,in_stack_fffffffffffffb08));
          bVar3 = Imf_2_5::operator!=((ConstIterator *)
                                      CONCAT44(in_stack_fffffffffffffb14,in_stack_fffffffffffffb10),
                                      (ConstIterator *)
                                      CONCAT44(in_stack_fffffffffffffb0c,in_stack_fffffffffffffb08))
          ;
          bVar2 = false;
          if (bVar3) {
            pcVar6 = ChannelList::ConstIterator::name((ConstIterator *)0x2a3c20);
            pcVar7 = FrameBuffer::ConstIterator::name((ConstIterator *)0x2a3c37);
            iVar4 = strcmp(pcVar6,pcVar7);
            bVar2 = iVar4 < 0;
          }
          if (!bVar2) break;
          pCVar9 = ChannelList::ConstIterator::channel((ConstIterator *)0x2a3c80);
          PVar10 = pCVar9->type;
          pCVar9 = ChannelList::ConstIterator::channel((ConstIterator *)0x2a3ca8);
          in_stack_fffffffffffffb10 = 1;
          in_stack_fffffffffffffb08 = 0;
          anon_unknown_8::TInSliceInfo::TInSliceInfo
                    (&local_250,PVar10,pCVar9->type,(char *)0x0,0,0,false,true,0.0,0,0);
          std::
          vector<Imf_2_5::(anonymous_namespace)::TInSliceInfo,_std::allocator<Imf_2_5::(anonymous_namespace)::TInSliceInfo>_>
          ::push_back((vector<Imf_2_5::(anonymous_namespace)::TInSliceInfo,_std::allocator<Imf_2_5::(anonymous_namespace)::TInSliceInfo>_>
                       *)CONCAT44(in_stack_fffffffffffffb14,in_stack_fffffffffffffb10),
                      (value_type *)CONCAT44(in_stack_fffffffffffffb0c,in_stack_fffffffffffffb08));
          ChannelList::ConstIterator::operator++
                    ((ConstIterator *)CONCAT44(in_stack_fffffffffffffb14,in_stack_fffffffffffffb10))
          ;
        }
        local_251 = 0;
        local_260._M_node =
             (_Base_ptr)
             ChannelList::end((ChannelList *)
                              CONCAT44(in_stack_fffffffffffffb0c,in_stack_fffffffffffffb08));
        bVar3 = Imf_2_5::operator==((ConstIterator *)
                                    CONCAT44(in_stack_fffffffffffffb14,in_stack_fffffffffffffb10),
                                    (ConstIterator *)
                                    CONCAT44(in_stack_fffffffffffffb0c,in_stack_fffffffffffffb08));
        bVar2 = true;
        if (!bVar3) {
          pcVar6 = ChannelList::ConstIterator::name((ConstIterator *)0x2a3dc0);
          pcVar7 = FrameBuffer::ConstIterator::name((ConstIterator *)0x2a3dd7);
          iVar4 = strcmp(pcVar6,pcVar7);
          bVar2 = 0 < iVar4;
        }
        if (bVar2) {
          local_251 = 1;
        }
        pSVar8 = FrameBuffer::ConstIterator::slice((ConstIterator *)0x2a3e25);
        PVar10 = pSVar8->type;
        if ((local_251 & 1) == 0) {
          pCVar9 = ChannelList::ConstIterator::channel((ConstIterator *)0x2a3e81);
          local_42c = pCVar9->type;
        }
        else {
          pSVar8 = FrameBuffer::ConstIterator::slice((ConstIterator *)0x2a3e57);
          local_42c = pSVar8->type;
        }
        pSVar8 = FrameBuffer::ConstIterator::slice((ConstIterator *)0x2a3eb7);
        in_stack_fffffffffffffba8 =
             (vector<Imf_2_5::(anonymous_namespace)::TInSliceInfo,_std::allocator<Imf_2_5::(anonymous_namespace)::TInSliceInfo>_>
              *)pSVar8->base;
        in_stack_fffffffffffffbb0 = FrameBuffer::ConstIterator::slice((ConstIterator *)0x2a3ee2);
        xs = in_stack_fffffffffffffbb0->xStride;
        pSVar8 = FrameBuffer::ConstIterator::slice((ConstIterator *)0x2a3f0d);
        bVar1 = local_251;
        ys = pSVar8->yStride;
        pSVar8 = FrameBuffer::ConstIterator::slice((ConstIterator *)0x2a3f43);
        fv = pSVar8->fillValue;
        pSVar8 = FrameBuffer::ConstIterator::slice((ConstIterator *)0x2a3f6d);
        bVar2 = pSVar8->xTileCoords;
        pSVar8 = FrameBuffer::ConstIterator::slice((ConstIterator *)0x2a3f91);
        in_stack_fffffffffffffb20 = pSVar8->yTileCoords & 1;
        in_stack_fffffffffffffb08 = bVar1 & 1;
        in_stack_fffffffffffffb10 = 0;
        anon_unknown_8::TInSliceInfo::TInSliceInfo
                  (&local_298,PVar10,local_42c,(char *)in_stack_fffffffffffffba8,xs,ys,
                   SUB41(in_stack_fffffffffffffb08,0),false,fv,bVar2 & 1,in_stack_fffffffffffffb20);
        std::
        vector<Imf_2_5::(anonymous_namespace)::TInSliceInfo,_std::allocator<Imf_2_5::(anonymous_namespace)::TInSliceInfo>_>
        ::push_back((vector<Imf_2_5::(anonymous_namespace)::TInSliceInfo,_std::allocator<Imf_2_5::(anonymous_namespace)::TInSliceInfo>_>
                     *)CONCAT44(in_stack_fffffffffffffb14,in_stack_fffffffffffffb10),
                    (value_type *)CONCAT44(in_stack_fffffffffffffb0c,in_stack_fffffffffffffb08));
        local_2a0._M_node =
             (_Base_ptr)
             ChannelList::end((ChannelList *)
                              CONCAT44(in_stack_fffffffffffffb0c,in_stack_fffffffffffffb08));
        bVar2 = Imf_2_5::operator!=((ConstIterator *)
                                    CONCAT44(in_stack_fffffffffffffb14,in_stack_fffffffffffffb10),
                                    (ConstIterator *)
                                    CONCAT44(in_stack_fffffffffffffb0c,in_stack_fffffffffffffb08));
        local_4aa = 0;
        if (bVar2) {
          local_4aa = local_251 ^ 0xff;
        }
        if ((local_4aa & 1) != 0) {
          ChannelList::ConstIterator::operator++
                    ((ConstIterator *)CONCAT44(in_stack_fffffffffffffb14,in_stack_fffffffffffffb10))
          ;
        }
        FrameBuffer::ConstIterator::operator++
                  ((ConstIterator *)CONCAT44(in_stack_fffffffffffffb14,in_stack_fffffffffffffb10));
      }
      while( true ) {
        local_2a8._M_node =
             (_Base_ptr)
             ChannelList::end((ChannelList *)
                              CONCAT44(in_stack_fffffffffffffb0c,in_stack_fffffffffffffb08));
        bVar2 = Imf_2_5::operator!=((ConstIterator *)
                                    CONCAT44(in_stack_fffffffffffffb14,in_stack_fffffffffffffb10),
                                    (ConstIterator *)
                                    CONCAT44(in_stack_fffffffffffffb0c,in_stack_fffffffffffffb08));
        if (!bVar2) break;
        pCVar9 = ChannelList::ConstIterator::channel((ConstIterator *)0x2a4100);
        PVar10 = pCVar9->type;
        pCVar9 = ChannelList::ConstIterator::channel((ConstIterator *)0x2a411f);
        in_stack_fffffffffffffb20 = 0;
        in_stack_fffffffffffffb10 = 1;
        in_stack_fffffffffffffb08 = 0;
        anon_unknown_8::TInSliceInfo::TInSliceInfo
                  (&local_2e0,PVar10,pCVar9->type,(char *)0x0,0,0,false,true,0.0,0,0);
        std::
        vector<Imf_2_5::(anonymous_namespace)::TInSliceInfo,_std::allocator<Imf_2_5::(anonymous_namespace)::TInSliceInfo>_>
        ::push_back((vector<Imf_2_5::(anonymous_namespace)::TInSliceInfo,_std::allocator<Imf_2_5::(anonymous_namespace)::TInSliceInfo>_>
                     *)CONCAT44(in_stack_fffffffffffffb14,in_stack_fffffffffffffb10),
                    (value_type *)CONCAT44(in_stack_fffffffffffffb0c,in_stack_fffffffffffffb08));
        ChannelList::ConstIterator::operator++
                  ((ConstIterator *)CONCAT44(in_stack_fffffffffffffb14,in_stack_fffffffffffffb10));
      }
      FrameBuffer::operator=
                ((FrameBuffer *)CONCAT44(in_stack_fffffffffffffb14,in_stack_fffffffffffffb10),
                 (FrameBuffer *)CONCAT44(in_stack_fffffffffffffb0c,in_stack_fffffffffffffb08));
      std::
      vector<Imf_2_5::(anonymous_namespace)::TInSliceInfo,_std::allocator<Imf_2_5::(anonymous_namespace)::TInSliceInfo>_>
      ::operator=((vector<Imf_2_5::(anonymous_namespace)::TInSliceInfo,_std::allocator<Imf_2_5::(anonymous_namespace)::TInSliceInfo>_>
                   *)in_stack_fffffffffffffbb0,in_stack_fffffffffffffba8);
      std::
      vector<Imf_2_5::(anonymous_namespace)::TInSliceInfo,_std::allocator<Imf_2_5::(anonymous_namespace)::TInSliceInfo>_>
      ::~vector((vector<Imf_2_5::(anonymous_namespace)::TInSliceInfo,_std::allocator<Imf_2_5::(anonymous_namespace)::TInSliceInfo>_>
                 *)CONCAT44(in_stack_fffffffffffffb24,in_stack_fffffffffffffb20));
      IlmThread_2_5::Lock::~Lock
                ((Lock *)CONCAT44(in_stack_fffffffffffffb14,in_stack_fffffffffffffb10));
      return;
    }
    FrameBuffer::ConstIterator::name((ConstIterator *)0x2a385c);
    local_50._M_node =
         (_Base_ptr)
         ChannelList::find(in_stack_fffffffffffffc18,
                           (char *)CONCAT44(in_stack_fffffffffffffc14,in_stack_fffffffffffffc10));
    local_58._M_node =
         (_Base_ptr)
         ChannelList::end((ChannelList *)
                          CONCAT44(in_stack_fffffffffffffb0c,in_stack_fffffffffffffb08));
    bVar2 = Imf_2_5::operator==((ConstIterator *)
                                CONCAT44(in_stack_fffffffffffffb14,in_stack_fffffffffffffb10),
                                (ConstIterator *)
                                CONCAT44(in_stack_fffffffffffffb0c,in_stack_fffffffffffffb08));
    if (!bVar2) {
      pCVar9 = ChannelList::ConstIterator::channel((ConstIterator *)0x2a3912);
      iVar4 = pCVar9->xSampling;
      pSVar8 = FrameBuffer::ConstIterator::slice((ConstIterator *)0x2a393b);
      if (iVar4 != pSVar8->xSampling) {
LAB_002a39b1:
        iex_debugTrap();
        std::__cxx11::stringstream::stringstream(local_1e0);
        poVar5 = std::operator<<(local_1d0,"X and/or y subsampling factors of \"");
        pcVar6 = ChannelList::ConstIterator::name((ConstIterator *)0x2a39f4);
        poVar5 = std::operator<<(poVar5,pcVar6);
        poVar5 = std::operator<<(poVar5,"\" channel of input file \"");
        pcVar6 = fileName((TiledInputFile *)0x2a3a48);
        poVar5 = std::operator<<(poVar5,pcVar6);
        std::operator<<(poVar5,"\" are not compatible with the frame buffer\'s subsampling factors."
                       );
        this_00 = (ArgExc *)__cxa_allocate_exception(0x48);
        Iex_2_5::ArgExc::ArgExc(this_00,local_1e0);
        __cxa_throw(this_00,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::ArgExc::~ArgExc);
      }
      pCVar9 = ChannelList::ConstIterator::channel((ConstIterator *)0x2a3966);
      iVar4 = pCVar9->ySampling;
      pSVar8 = FrameBuffer::ConstIterator::slice((ConstIterator *)0x2a398f);
      if (iVar4 != pSVar8->ySampling) goto LAB_002a39b1;
    }
    FrameBuffer::ConstIterator::operator++
              ((ConstIterator *)CONCAT44(in_stack_fffffffffffffb14,in_stack_fffffffffffffb10));
  } while( true );
}

Assistant:

void	
TiledInputFile::setFrameBuffer (const FrameBuffer &frameBuffer)
{
    Lock lock (*_data->_streamData);

    //
    // Set the frame buffer
    //

    //
    // Check if the new frame buffer descriptor is
    // compatible with the image file header.
    //

    const ChannelList &channels = _data->header.channels();

    for (FrameBuffer::ConstIterator j = frameBuffer.begin();
         j != frameBuffer.end();
         ++j)
    {
        ChannelList::ConstIterator i = channels.find (j.name());

        if (i == channels.end())
            continue;

        if (i.channel().xSampling != j.slice().xSampling ||
            i.channel().ySampling != j.slice().ySampling)
            THROW (IEX_NAMESPACE::ArgExc, "X and/or y subsampling factors "
				"of \"" << i.name() << "\" channel "
				"of input file \"" << fileName() << "\" are "
				"not compatible with the frame buffer's "
				"subsampling factors.");
    }

    //
    // Initialize the slice table for readPixels().
    //

    vector<TInSliceInfo> slices;
    ChannelList::ConstIterator i = channels.begin();

    for (FrameBuffer::ConstIterator j = frameBuffer.begin();
         j != frameBuffer.end();
         ++j)
    {
        while (i != channels.end() && strcmp (i.name(), j.name()) < 0)
        {
            //
            // Channel i is present in the file but not
            // in the frame buffer; data for channel i
            // will be skipped during readPixels().
            //

            slices.push_back (TInSliceInfo (i.channel().type,
					    i.channel().type,
					    0,      // base
					    0,      // xStride
					    0,      // yStride
					    false,  // fill
					    true,   // skip
					    0.0));  // fillValue
            ++i;
        }

        bool fill = false;

        if (i == channels.end() || strcmp (i.name(), j.name()) > 0)
        {
            //
            // Channel i is present in the frame buffer, but not in the file.
            // In the frame buffer, slice j will be filled with a default value.
            //

            fill = true;
        }

        slices.push_back (TInSliceInfo (j.slice().type,
                                        fill? j.slice().type: i.channel().type,
                                        j.slice().base,
                                        j.slice().xStride,
                                        j.slice().yStride,
                                        fill,
                                        false, // skip
                                        j.slice().fillValue,
                                        (j.slice().xTileCoords)? 1: 0,
                                        (j.slice().yTileCoords)? 1: 0));

        if (i != channels.end() && !fill)
            ++i;
    }

    while (i != channels.end())
    {
	//
	// Channel i is present in the file but not
	// in the frame buffer; data for channel i
	// will be skipped during readPixels().
	//

	slices.push_back (TInSliceInfo (i.channel().type,
					i.channel().type,
					0, // base
					0, // xStride
					0, // yStride
					false,  // fill
					true, // skip
					0.0)); // fillValue
	++i;
    }

    //
    // Store the new frame buffer.
    //

    _data->frameBuffer = frameBuffer;
    _data->slices = slices;
}